

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

void __thiscall AActor::Thrust(AActor *this)

{
  Angle *this_00;
  double dVar1;
  double dVar2;
  
  dVar1 = this->Speed;
  this_00 = &(this->Angles).Yaw;
  dVar2 = TAngle<double>::Cos(this_00);
  (this->Vel).X = dVar2 * dVar1 + (this->Vel).X;
  dVar1 = this->Speed;
  dVar2 = TAngle<double>::Sin(this_00);
  (this->Vel).Y = dVar2 * dVar1 + (this->Vel).Y;
  return;
}

Assistant:

void Thrust()
	{
		Vel.X += Speed * Angles.Yaw.Cos();
		Vel.Y += Speed * Angles.Yaw.Sin();
	}